

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::resume_download(torrent *this)

{
  bool in;
  
  if ((this->field_0x5cc & 4) != 0) {
    leave_seed_mode(this,check_files);
  }
  set_state(this,downloading);
  set_queue_position(this,(queue_position_t)0x7fffffff);
  this->m_completed_time = 0;
  (*(this->super_request_callback)._vptr_request_callback[7])(this,"*** RESUME_DOWNLOAD");
  send_upload_only(this);
  in = want_tick(this);
  update_list(this,(torrent_list_index_t)0x1,in);
  update_state_list(this);
  return;
}

Assistant:

void torrent::resume_download()
	{
		// the invariant doesn't hold here, because it expects the torrent
		// to be in downloading state (which it will be set to shortly)
//		INVARIANT_CHECK;

		TORRENT_ASSERT(m_state != torrent_status::checking_resume_data
			&& m_state != torrent_status::checking_files);

		// we're downloading now, which means we're no longer in seed mode
		if (m_seed_mode)
			leave_seed_mode(seed_mode_t::check_files);

		TORRENT_ASSERT(!is_finished());
		set_state(torrent_status::downloading);
		set_queue_position(last_pos);

		m_completed_time = 0;

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("*** RESUME_DOWNLOAD");
#endif
		send_upload_only();
		update_want_tick();
		update_state_list();
	}